

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O1

GTreeNode * g_tree_node_rotate_right(GTreeNode *node)

{
  char cVar1;
  char cVar2;
  GTreeNode *pGVar3;
  char cVar4;
  char cVar5;
  
  pGVar3 = node->left;
  if (pGVar3->right_child == '\0') {
    node->left_child = '\0';
    pGVar3->right_child = '\x01';
  }
  else {
    node->left = pGVar3->right;
  }
  pGVar3->right = node;
  cVar1 = node->balance;
  cVar2 = pGVar3->balance;
  if (cVar2 < '\x01') {
    cVar4 = cVar1 - cVar2;
    cVar5 = cVar2 + '\x01';
    if (cVar2 <= cVar1) {
      cVar5 = cVar1 + '\x02';
    }
    pGVar3->balance = cVar5;
  }
  else {
    cVar4 = '\x01';
    if (-1 < cVar1) {
      cVar4 = cVar1 + '\x02';
    }
    pGVar3->balance = cVar2 + cVar4;
    cVar4 = cVar1;
  }
  node->balance = cVar4 + '\x01';
  return pGVar3;
}

Assistant:

static GTreeNode *g_tree_node_rotate_right (GTreeNode *node)
{
    GTreeNode *left;
    gint a_bal;
    gint b_bal;

    left = node->left;

    if (left->right_child)
        node->left = left->right;
    else
    {
        node->left_child = FALSE;
        left->right_child = TRUE;
    }
    left->right = node;

    a_bal = node->balance;
    b_bal = left->balance;

    if (b_bal <= 0)
    {
        if (b_bal > a_bal)
            left->balance = b_bal + 1;
        else
            left->balance = a_bal + 2;
        node->balance = a_bal - b_bal + 1;
    }
    else
    {
        if (a_bal <= -1)
            left->balance = b_bal + 1;
        else
            left->balance = a_bal + b_bal + 2;
        node->balance = a_bal + 1;
    }

    return left;
}